

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O1

HRESULT __thiscall
JsrtDebugManager::DbgRegisterFunction
          (JsrtDebugManager *this,ScriptContext *scriptContext,FunctionBody *functionBody,
          DWORD_PTR dwDebugSourceContext,LPCWSTR title)

{
  Utf8SourceInfo *utf8SourceInfo;
  code *pcVar1;
  bool bVar2;
  JsrtDebugDocumentManager *pJVar3;
  undefined4 *puVar4;
  HeapAllocator *this_00;
  DebugDocument *this_01;
  DebugContext *pDVar5;
  DynamicObject *object;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  utf8SourceInfo =
       (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
  if (((utf8SourceInfo->field_0xa8 & 4) == 0) &&
     ((utf8SourceInfo->m_debugDocument).ptr == (DebugDocument *)0x0)) {
    pJVar3 = GetDebugDocumentManager(this);
    if (pJVar3 == (JsrtDebugDocumentManager *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebugManager.cpp"
                         ,0x98,"(debugDocumentManager != nullptr)","debugDocumentManager != nullptr"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    local_58 = (undefined1  [8])&Js::DebugDocument::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_26fb6c;
    data.filename._0_4_ = 0x9a;
    this_00 = Memory::HeapAllocator::TrackAllocInfo
                        (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_58);
    this_01 = (DebugDocument *)Memory::HeapAllocator::AllocT<true>(this_00,0x20);
    Js::DebugDocument::DebugDocument(this_01,utf8SourceInfo,functionBody);
    Js::Utf8SourceInfo::SetDebugDocument(utf8SourceInfo,this_01);
    if (this->debugEventCallback != (JsDiagDebugEventCallback)0x0) {
      pDVar5 = Js::ScriptContext::GetDebugContext(scriptContext);
      if ((pDVar5->field_0x1c & 2) == 0) {
        JsrtDebugEventObject::JsrtDebugEventObject((JsrtDebugEventObject *)local_58,scriptContext);
        object = JsrtDebugEventObject::GetEventDataObject((JsrtDebugEventObject *)local_58);
        JsrtDebugUtils::AddSourceMetadataToObject(object,utf8SourceInfo);
        CallDebugEventCallback(this,JsDiagDebugEventSourceCompile,object,scriptContext,false);
        JsrtDebugEventObject::~JsrtDebugEventObject((JsrtDebugEventObject *)local_58);
      }
    }
  }
  return 0;
}

Assistant:

HRESULT JsrtDebugManager::DbgRegisterFunction(Js::ScriptContext* scriptContext, Js::FunctionBody* functionBody, DWORD_PTR dwDebugSourceContext, LPCWSTR title)
{
    Js::Utf8SourceInfo* utf8SourceInfo = functionBody->GetUtf8SourceInfo();

    if (!utf8SourceInfo->GetIsLibraryCode() && !utf8SourceInfo->HasDebugDocument())
    {
        JsrtDebugDocumentManager* debugDocumentManager = this->GetDebugDocumentManager();
        Assert(debugDocumentManager != nullptr);

        Js::DebugDocument* debugDocument = HeapNewNoThrow(Js::DebugDocument, utf8SourceInfo, functionBody);
        if (debugDocument != nullptr)
        {
            utf8SourceInfo->SetDebugDocument(debugDocument);
        }

        // Raising events during the middle of a source reparse allows the host to reenter the
        // script context and cause memory race conditions. Suppressing these events during a
        // reparse prevents the issue. Since the host was already expected to call JsDiagGetScripts
        // once the attach is completed to get the list of parsed scripts, there is no change in
        // behavior.
        if (this->debugEventCallback != nullptr &&
            !scriptContext->GetDebugContext()->GetIsReparsingSource())
        {
            JsrtDebugEventObject debugEventObject(scriptContext);
            Js::DynamicObject* eventDataObject = debugEventObject.GetEventDataObject();
            JsrtDebugUtils::AddSourceMetadataToObject(eventDataObject, utf8SourceInfo);

            this->CallDebugEventCallback(JsDiagDebugEventSourceCompile, eventDataObject, scriptContext, false /*isBreak*/);
        }
    }

    return S_OK;
}